

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint *puVar4;
  ImGuiWindow *tooltip_window;
  ImGuiPayload *payload;
  ImGuiID local_30;
  ImGuiID IStack_2c;
  bool is_hovered;
  ImGuiID source_parent_id;
  ImGuiID source_id;
  bool source_drag_active;
  ImGuiMouseButton mouse_button;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiDragDropFlags flags_local;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  source_id = 0;
  local_30 = 0;
  if ((flags & 0x10U) == 0) {
    IStack_2c = (GImGui->LastItemData).ID;
    if (IStack_2c == 0) {
      if ((((GImGui->IO).MouseDown[0] & 1U) == 0) || ((pIVar1->SkipItems & 1U) != 0)) {
        return false;
      }
      if ((((GImGui->LastItemData).StatusFlags & 1U) == 0) &&
         ((GImGui->ActiveId == 0 || (GImGui->ActiveIdWindow != pIVar1)))) {
        return false;
      }
      if ((flags & 8U) == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui.cpp"
                      ,0x2b6d,"bool ImGui::BeginDragDropSource(ImGuiDragDropFlags)");
      }
      IStack_2c = ImGuiWindow::GetIDFromRectangle(pIVar1,&(GImGui->LastItemData).Rect);
      (pIVar2->LastItemData).ID = IStack_2c;
      KeepAliveID(IStack_2c);
      bVar3 = ItemHoverable(&(pIVar2->LastItemData).Rect,IStack_2c);
      if ((bVar3) && (((pIVar2->IO).MouseClicked[0] & 1U) != 0)) {
        SetActiveID(IStack_2c,pIVar1);
        FocusWindow(pIVar1);
      }
      if (pIVar2->ActiveId == IStack_2c) {
        pIVar2->ActiveIdAllowOverlap = bVar3;
      }
    }
    else {
      if (GImGui->ActiveId != IStack_2c) {
        return false;
      }
      if (GImGui->ActiveIdMouseButton != -1) {
        source_id = GImGui->ActiveIdMouseButton;
      }
      if ((((GImGui->IO).MouseDown[(int)source_id] & 1U) == 0) || ((pIVar1->SkipItems & 1U) != 0)) {
        return false;
      }
      GImGui->ActiveIdAllowOverlap = false;
    }
    if (pIVar2->ActiveId != IStack_2c) {
      return false;
    }
    puVar4 = ImVector<unsigned_int>::back(&pIVar1->IDStack);
    local_30 = *puVar4;
    source_parent_id._3_1_ = IsMouseDragging(source_id,-1.0);
    SetActiveIdUsingNavAndKeys();
  }
  else {
    IStack_2c = ImHashStr("#SourceExtern",0,0);
    source_parent_id._3_1_ = true;
  }
  if (source_parent_id._3_1_ == false) {
    g._7_1_ = false;
  }
  else {
    if ((pIVar2->DragDropActive & 1U) == 0) {
      if (IStack_2c == 0) {
        __assert_fail("source_id != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui.cpp"
                      ,0x2b94,"bool ImGui::BeginDragDropSource(ImGuiDragDropFlags)");
      }
      ClearDragDrop();
      (pIVar2->DragDropPayload).SourceId = IStack_2c;
      (pIVar2->DragDropPayload).SourceParentId = local_30;
      pIVar2->DragDropActive = true;
      pIVar2->DragDropSourceFlags = flags;
      pIVar2->DragDropMouseButton = source_id;
      if ((pIVar2->DragDropPayload).SourceId == pIVar2->ActiveId) {
        pIVar2->ActiveIdNoClearOnFocusLoss = true;
      }
    }
    pIVar2->DragDropSourceFrameCount = pIVar2->FrameCount;
    pIVar2->DragDropWithinSource = true;
    if ((((flags & 1U) == 0) && (BeginTooltip(), pIVar2->DragDropAcceptIdPrev != 0)) &&
       ((pIVar2->DragDropAcceptFlags & 0x1000U) != 0)) {
      pIVar1 = pIVar2->CurrentWindow;
      pIVar1->SkipItems = true;
      pIVar1->Hidden = true;
      pIVar1->HiddenFramesCanSkipItems = '\x01';
    }
    if (((flags & 2U) == 0) && ((flags & 0x10U) == 0)) {
      (pIVar2->LastItemData).StatusFlags = (pIVar2->LastItemData).StatusFlags & 0xfffffffe;
    }
    g._7_1_ = true;
  }
  return g._7_1_;
}

Assistant:

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // FIXME-DRAGDROP: While in the common-most "drag from non-zero active id" case we can tell the mouse button,
    // in both SourceExtern and id==0 cases we may requires something else (explicit flags or some heuristic).
    ImGuiMouseButton mouse_button = ImGuiMouseButton_Left;

    bool source_drag_active = false;
    ImGuiID source_id = 0;
    ImGuiID source_parent_id = 0;
    if (!(flags & ImGuiDragDropFlags_SourceExtern))
    {
        source_id = g.LastItemData.ID;
        if (source_id != 0)
        {
            // Common path: items with ID
            if (g.ActiveId != source_id)
                return false;
            if (g.ActiveIdMouseButton != -1)
                mouse_button = g.ActiveIdMouseButton;
            if (g.IO.MouseDown[mouse_button] == false || window->SkipItems)
                return false;
            g.ActiveIdAllowOverlap = false;
        }
        else
        {
            // Uncommon path: items without ID
            if (g.IO.MouseDown[mouse_button] == false || window->SkipItems)
                return false;
            if ((g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HoveredRect) == 0 && (g.ActiveId == 0 || g.ActiveIdWindow != window))
                return false;

            // If you want to use BeginDragDropSource() on an item with no unique identifier for interaction, such as Text() or Image(), you need to:
            // A) Read the explanation below, B) Use the ImGuiDragDropFlags_SourceAllowNullID flag.
            if (!(flags & ImGuiDragDropFlags_SourceAllowNullID))
            {
                IM_ASSERT(0);
                return false;
            }

            // Magic fallback to handle items with no assigned ID, e.g. Text(), Image()
            // We build a throwaway ID based on current ID stack + relative AABB of items in window.
            // THE IDENTIFIER WON'T SURVIVE ANY REPOSITIONING/RESIZINGG OF THE WIDGET, so if your widget moves your dragging operation will be canceled.
            // We don't need to maintain/call ClearActiveID() as releasing the button will early out this function and trigger !ActiveIdIsAlive.
            // Rely on keeping other window->LastItemXXX fields intact.
            source_id = g.LastItemData.ID = window->GetIDFromRectangle(g.LastItemData.Rect);
            KeepAliveID(source_id);
            bool is_hovered = ItemHoverable(g.LastItemData.Rect, source_id);
            if (is_hovered && g.IO.MouseClicked[mouse_button])
            {
                SetActiveID(source_id, window);
                FocusWindow(window);
            }
            if (g.ActiveId == source_id) // Allow the underlying widget to display/return hovered during the mouse release frame, else we would get a flicker.
                g.ActiveIdAllowOverlap = is_hovered;
        }
        if (g.ActiveId != source_id)
            return false;
        source_parent_id = window->IDStack.back();
        source_drag_active = IsMouseDragging(mouse_button);

        // Disable navigation and key inputs while dragging + cancel existing request if any
        SetActiveIdUsingNavAndKeys();
    }
    else
    {
        window = NULL;
        source_id = ImHashStr("#SourceExtern");
        source_drag_active = true;
    }

    if (source_drag_active)
    {
        if (!g.DragDropActive)
        {
            IM_ASSERT(source_id != 0);
            ClearDragDrop();
            ImGuiPayload& payload = g.DragDropPayload;
            payload.SourceId = source_id;
            payload.SourceParentId = source_parent_id;
            g.DragDropActive = true;
            g.DragDropSourceFlags = flags;
            g.DragDropMouseButton = mouse_button;
            if (payload.SourceId == g.ActiveId)
                g.ActiveIdNoClearOnFocusLoss = true;
        }
        g.DragDropSourceFrameCount = g.FrameCount;
        g.DragDropWithinSource = true;

        if (!(flags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
        {
            // Target can request the Source to not display its tooltip (we use a dedicated flag to make this request explicit)
            // We unfortunately can't just modify the source flags and skip the call to BeginTooltip, as caller may be emitting contents.
            BeginTooltip();
            if (g.DragDropAcceptIdPrev && (g.DragDropAcceptFlags & ImGuiDragDropFlags_AcceptNoPreviewTooltip))
            {
                ImGuiWindow* tooltip_window = g.CurrentWindow;
                tooltip_window->Hidden = tooltip_window->SkipItems = true;
                tooltip_window->HiddenFramesCanSkipItems = 1;
            }
        }

        if (!(flags & ImGuiDragDropFlags_SourceNoDisableHover) && !(flags & ImGuiDragDropFlags_SourceExtern))
            g.LastItemData.StatusFlags &= ~ImGuiItemStatusFlags_HoveredRect;

        return true;
    }
    return false;
}